

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O3

void __thiscall
diy::Master::Command<Block>::Command(Command<Block> *this,Callback<Block> *f_,Skip *s_)

{
  (this->super_BaseCommand)._vptr_BaseCommand = (_func_int **)&PTR__Command_001be9c0;
  Catch::clara::std::function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)>::function
            (&this->f,f_);
  Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::function(&this->s,s_);
  return;
}

Assistant:

Command(Callback<Block> f_, const Skip& s_):
                  f(f_), s(s_)                                                        {}